

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JxParser.cpp
# Opt level: O0

bool __thiscall
Jinx::Impl::Parser::CheckFunctionSignature
          (Parser *this,SymbolListCItr currSym,FunctionSignature *signature,size_t *symCount)

{
  bool bVar1;
  bool bVar2;
  FunctionSignaturePartsI *pFVar3;
  reference_conflict1 pFVar4;
  pointer pSVar5;
  reference __lhs;
  basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_> *name;
  const_iterator __end4;
  const_iterator __begin4;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>,_Jinx::StaticAllocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>,_128UL,_16UL>_>
  *__range4;
  bool matched;
  FunctionSignaturePart *part;
  const_iterator __end2;
  const_iterator __begin2;
  FunctionSignaturePartsI *__range2;
  size_t count;
  size_t *symCount_local;
  FunctionSignature *signature_local;
  Parser *this_local;
  SymbolListCItr currSym_local;
  
  __range2 = (FunctionSignaturePartsI *)0x0;
  if (symCount != (size_t *)0x0) {
    *symCount = 0;
  }
  this_local = (Parser *)currSym._M_current;
  pFVar3 = FunctionSignature::GetParts(signature);
  __end2 = std::
           vector<Jinx::Impl::FunctionSignaturePart,_Jinx::StaticAllocator<Jinx::Impl::FunctionSignaturePart,_1024UL,_16UL>_>
           ::begin(pFVar3);
  part = (FunctionSignaturePart *)
         std::
         vector<Jinx::Impl::FunctionSignaturePart,_Jinx::StaticAllocator<Jinx::Impl::FunctionSignaturePart,_1024UL,_16UL>_>
         ::end(pFVar3);
  do {
    bVar1 = __gnu_cxx::operator!=
                      (&__end2,(__normal_iterator<const_Jinx::Impl::FunctionSignaturePart_*,_std::vector<Jinx::Impl::FunctionSignaturePart,_Jinx::StaticAllocator<Jinx::Impl::FunctionSignaturePart,_1024UL,_16UL>_>_>
                                *)&part);
    if (!bVar1) {
      if (symCount != (size_t *)0x0) {
        *symCount = (long)&(__range2->
                           super__Vector_base<Jinx::Impl::FunctionSignaturePart,_Jinx::StaticAllocator<Jinx::Impl::FunctionSignaturePart,_1024UL,_16UL>_>
                           )._M_impl.super__Tp_alloc_type.m_arena + *symCount;
      }
      return true;
    }
    pFVar4 = __gnu_cxx::
             __normal_iterator<const_Jinx::Impl::FunctionSignaturePart_*,_std::vector<Jinx::Impl::FunctionSignaturePart,_Jinx::StaticAllocator<Jinx::Impl::FunctionSignaturePart,_1024UL,_16UL>_>_>
             ::operator*(&__end2);
    bVar1 = IsSymbolValid(this,(SymbolListCItr)this_local);
    if (!bVar1) {
      return false;
    }
    if (pFVar4->partType == Parameter) {
      pSVar5 = __gnu_cxx::
               __normal_iterator<const_Jinx::Impl::Symbol_*,_std::vector<Jinx::Impl::Symbol,_Jinx::Allocator<Jinx::Impl::Symbol>_>_>
               ::operator->((__normal_iterator<const_Jinx::Impl::Symbol_*,_std::vector<Jinx::Impl::Symbol,_Jinx::Allocator<Jinx::Impl::Symbol>_>_>
                             *)&this_local);
      if (pSVar5->type != CurlyOpen) {
        return false;
      }
      __gnu_cxx::
      __normal_iterator<const_Jinx::Impl::Symbol_*,_std::vector<Jinx::Impl::Symbol,_Jinx::Allocator<Jinx::Impl::Symbol>_>_>
      ::operator++((__normal_iterator<const_Jinx::Impl::Symbol_*,_std::vector<Jinx::Impl::Symbol,_Jinx::Allocator<Jinx::Impl::Symbol>_>_>
                    *)&this_local);
      bVar1 = IsSymbolValid(this,(SymbolListCItr)this_local);
      if (!bVar1) {
        return false;
      }
      bVar1 = CheckValueType(this,(SymbolListCItr)this_local);
      pFVar3 = (FunctionSignaturePartsI *)
               ((long)&(__range2->
                       super__Vector_base<Jinx::Impl::FunctionSignaturePart,_Jinx::StaticAllocator<Jinx::Impl::FunctionSignaturePart,_1024UL,_16UL>_>
                       )._M_impl.super__Tp_alloc_type.m_arena + 1);
      if (bVar1) {
        __gnu_cxx::
        __normal_iterator<const_Jinx::Impl::Symbol_*,_std::vector<Jinx::Impl::Symbol,_Jinx::Allocator<Jinx::Impl::Symbol>_>_>
        ::operator++((__normal_iterator<const_Jinx::Impl::Symbol_*,_std::vector<Jinx::Impl::Symbol,_Jinx::Allocator<Jinx::Impl::Symbol>_>_>
                      *)&this_local);
        bVar1 = IsSymbolValid(this,(SymbolListCItr)this_local);
        pFVar3 = (FunctionSignaturePartsI *)
                 ((long)&(__range2->
                         super__Vector_base<Jinx::Impl::FunctionSignaturePart,_Jinx::StaticAllocator<Jinx::Impl::FunctionSignaturePart,_1024UL,_16UL>_>
                         )._M_impl.super__Tp_alloc_type.m_arena + 2);
        if (!bVar1) {
          return false;
        }
      }
      __range2 = pFVar3;
      pSVar5 = __gnu_cxx::
               __normal_iterator<const_Jinx::Impl::Symbol_*,_std::vector<Jinx::Impl::Symbol,_Jinx::Allocator<Jinx::Impl::Symbol>_>_>
               ::operator->((__normal_iterator<const_Jinx::Impl::Symbol_*,_std::vector<Jinx::Impl::Symbol,_Jinx::Allocator<Jinx::Impl::Symbol>_>_>
                             *)&this_local);
      if (pSVar5->type != CurlyClose) {
        return false;
      }
    }
    else {
      bVar1 = false;
      __end4 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>,_Jinx::StaticAllocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>,_128UL,_16UL>_>
               ::begin(&pFVar4->names);
      name = (basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_> *)
             std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>,_Jinx::StaticAllocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>,_128UL,_16UL>_>
             ::end(&pFVar4->names);
      while (bVar2 = __gnu_cxx::operator!=
                               (&__end4,(__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>,_Jinx::StaticAllocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>,_128UL,_16UL>_>_>
                                         *)&name), bVar2) {
        __lhs = __gnu_cxx::
                __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>,_Jinx::StaticAllocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>,_128UL,_16UL>_>_>
                ::operator*(&__end4);
        pSVar5 = __gnu_cxx::
                 __normal_iterator<const_Jinx::Impl::Symbol_*,_std::vector<Jinx::Impl::Symbol,_Jinx::Allocator<Jinx::Impl::Symbol>_>_>
                 ::operator->((__normal_iterator<const_Jinx::Impl::Symbol_*,_std::vector<Jinx::Impl::Symbol,_Jinx::Allocator<Jinx::Impl::Symbol>_>_>
                               *)&this_local);
        bVar2 = std::operator==(__lhs,&pSVar5->text);
        if (bVar2) {
          bVar1 = true;
          break;
        }
        __gnu_cxx::
        __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>,_Jinx::StaticAllocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>,_128UL,_16UL>_>_>
        ::operator++(&__end4);
      }
      if ((!bVar1) && ((pFVar4->optional & 1U) == 0)) {
        return false;
      }
    }
    __gnu_cxx::
    __normal_iterator<const_Jinx::Impl::Symbol_*,_std::vector<Jinx::Impl::Symbol,_Jinx::Allocator<Jinx::Impl::Symbol>_>_>
    ::operator++((__normal_iterator<const_Jinx::Impl::Symbol_*,_std::vector<Jinx::Impl::Symbol,_Jinx::Allocator<Jinx::Impl::Symbol>_>_>
                  *)&this_local);
    __range2 = (FunctionSignaturePartsI *)
               ((long)&(__range2->
                       super__Vector_base<Jinx::Impl::FunctionSignaturePart,_Jinx::StaticAllocator<Jinx::Impl::FunctionSignaturePart,_1024UL,_16UL>_>
                       )._M_impl.super__Tp_alloc_type.m_arena + 1);
    __gnu_cxx::
    __normal_iterator<const_Jinx::Impl::FunctionSignaturePart_*,_std::vector<Jinx::Impl::FunctionSignaturePart,_Jinx::StaticAllocator<Jinx::Impl::FunctionSignaturePart,_1024UL,_16UL>_>_>
    ::operator++(&__end2);
  } while( true );
}

Assistant:

inline_t bool Parser::CheckFunctionSignature(SymbolListCItr currSym, const FunctionSignature & signature, size_t * symCount) const
	{
		size_t count = 0;
		if (symCount)
			*symCount = 0;
		for (const auto & part : signature.GetParts())
		{
			if (!IsSymbolValid(currSym))
				return false;
			if (part.partType == FunctionSignaturePartType::Parameter)
			{
				if (currSym->type != SymbolType::CurlyOpen)
					return false;
				++currSym;
				++count;
				if (!IsSymbolValid(currSym))
					return false;
				if (CheckValueType(currSym))
				{
					++currSym;
					++count;
					if (!IsSymbolValid(currSym))
						return false;
				}
				if (currSym->type != SymbolType::CurlyClose)
					return false;
			}
			else
			{
				bool matched = false;
				for (const auto & name : part.names)
				{
					if (name == currSym->text)
					{
						matched = true;
						break;
					}
				}
				if (!matched && !part.optional)
					return false;
			}
			++currSym;
			++count;
		}
		if (symCount)
			*symCount += count;
		return true;
	}